

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

string * __thiscall
gmath::Camera::getCameraKey_abi_cxx11_(string *__return_storage_ptr__,Camera *this,char *key,int id)

{
  ostream *poVar1;
  size_t sVar2;
  ostringstream os;
  undefined1 auStack_1a8 [15];
  char local_199;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"camera.",7);
  if (-1 < id) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,id);
    local_199 = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  }
  if (key == (char *)0x0) {
    std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x10);
  }
  else {
    sVar2 = strlen(key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,key,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Camera::getCameraKey(const char *key, int id) const
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}